

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O2

void makeroguerooms(level *lev)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  rogueroom (*parVar10) [3];
  rogueroom *prVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uchar *puVar15;
  uchar *puVar16;
  
  lev->nroom = 0;
  lVar13 = 0x321d25;
  lVar7 = 0;
  do {
    if (lVar7 == 3) {
      uVar4 = mt_random();
      uVar6 = mt_random();
      miniwalk(uVar4 % 3,uVar6 % 3);
      lev->nroom = 0;
      parVar10 = r;
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        lVar13 = 0;
        prVar11 = *parVar10;
        for (; lVar13 != 0x4e; lVar13 = lVar13 + 0x1a) {
          if (prVar11->real != '\0') {
            iVar8 = lev->nroom;
            prVar11->nroom = iVar8;
            smeq[iVar8] = iVar8;
            iVar8 = (int)((rogueroom *)&prVar11->rlx)->rlx;
            iVar5 = (int)prVar11->rly + (int)lVar7 * 7;
            cVar1 = prVar11->dx;
            cVar2 = prVar11->dy;
            uVar4 = mt_random();
            add_room(lev,(int)lVar13 + iVar8 + 1,iVar5,cVar1 + iVar8 + (int)lVar13,
                     cVar2 + iVar5 + -1,uVar4 % 7 == 0,'\0','\0');
          }
          prVar11 = prVar11 + 3;
        }
        parVar10 = (rogueroom (*) [3])((long)parVar10 + 0xc);
      }
      puVar16 = &r[0][0].doortable;
      for (uVar12 = 0; uVar12 != 3; uVar12 = uVar12 + 1) {
        puVar15 = puVar16;
        for (uVar14 = 0; uVar14 != 3; uVar14 = uVar14 + 1) {
          bVar3 = *puVar15;
          if ((bVar3 & 2) != 0) {
            roguecorr(lev,(int)uVar14,(int)uVar12,2);
            bVar3 = *puVar15;
          }
          if ((bVar3 & 8) != 0) {
            roguecorr(lev,(int)uVar14,(int)uVar12,8);
            bVar3 = *puVar15;
          }
          if ((bVar3 & 4) != 0) {
            impossible("left end of %d, %d never connected?",uVar14 & 0xffffffff,uVar12 & 0xffffffff
                      );
            bVar3 = *puVar15;
          }
          if ((bVar3 & 1) != 0) {
            impossible("up end of %d, %d never connected?",uVar14 & 0xffffffff,uVar12 & 0xffffffff);
          }
          puVar15 = puVar15 + 0x24;
        }
        puVar16 = puVar16 + 0xc;
      }
      return;
    }
    iVar8 = (lVar7 == 2) + 3;
    for (lVar9 = 0; lVar9 != 0x6c; lVar9 = lVar9 + 0x24) {
      uVar4 = mt_random();
      if (uVar4 % 5 == 0) {
        if ((lev->nroom == 0) && (lVar7 == 2 || lVar9 == 0x48)) goto LAB_0019881f;
        *(undefined1 *)(lVar13 + -1 + lVar9) = 0;
        uVar4 = mt_random();
        *(char *)(lVar13 + -5 + lVar9) = (char)((ulong)uVar4 % 0x16) + '\x02';
        iVar5 = rn2(iVar8);
        *(char *)(lVar13 + -4 + lVar9) = (char)iVar5 + '\x02';
      }
      else {
LAB_0019881f:
        *(undefined1 *)(lVar13 + -1 + lVar9) = 1;
        uVar4 = mt_random();
        *(char *)(lVar13 + -3 + lVar9) = (char)((ulong)uVar4 % 0x16) + '\x02';
        iVar5 = rn2(iVar8);
        *(char *)(lVar13 + -2 + lVar9) = (char)iVar5 + '\x02';
        iVar5 = rnd(0x18 - *(char *)(lVar13 + -3 + lVar9));
        *(char *)(lVar13 + -5 + lVar9) = (char)iVar5;
        iVar5 = rnd(((lVar7 == 2) + 5) - (int)*(char *)(lVar13 + -2 + lVar9));
        *(char *)(lVar13 + -4 + lVar9) = (char)iVar5;
        lev->nroom = lev->nroom + 1;
      }
      *(undefined1 *)(lVar13 + lVar9) = 0;
    }
    lVar7 = lVar7 + 1;
    lVar13 = lVar13 + 0xc;
  } while( true );
}

Assistant:

void makeroguerooms(struct level *lev) {
	int x,y;
	/* Rogue levels are structured 3 by 3, with each section containing
	 * a room or an intersection.  The minimum width is 2 each way.
	 * One difference between these and "real" Rogue levels: real Rogue
	 * uses 24 rows and this game only 23.  So we cheat a bit by making
	 * the second row of rooms not as deep.
	 *
	 * Each normal space has 6/7 rows and 25 columns in which a room may
	 * actually be placed.  Walls go from rows 0-5/6 and columns 0-24.
	 * Not counting walls, the room may go in
	 * rows 1-5 and columns 1-23 (numbering starting at 0).  A room
	 * coordinate of this type may be converted to a level coordinate
	 * by adding 1+28*x to the column, and 7*y to the row.  (The 1
	 * is because column 0 isn't used [we only use 1-78]).
	 * Room height may be 2-4 (2-5 on last row), length 2-23 (not
	 * counting walls)
	 */
#define here r[x][y]

	lev->nroom = 0;
	for (y=0; y<3; y++) for(x=0; x<3; x++) {
		/* Note: we want to insure at least 1 room.  So, if the
		 * first 8 are all dummies, force the last to be a room.
		 */
		if (!rn2(5) && (lev->nroom || (x<2 && y<2))) {
			/* Arbitrary: dummy rooms may only go where real
			 * ones do.
			 */
			here.real = FALSE;
			here.rlx = rn1(22, 2);
			here.rly = rn1((y==2)?4:3, 2);
		} else {
			here.real = TRUE;
			here.dx = rn1(22, 2); /* 2-23 long, plus walls */
			here.dy = rn1((y==2)?4:3, 2); /* 2-5 high, plus walls */

			/* boundaries of room floor */
			here.rlx = rnd(23 - here.dx + 1);
			here.rly = rnd(((y==2) ? 5 : 4)- here.dy + 1);
			lev->nroom++;
		}
		here.doortable = 0;
	}
	x = rn2(3);
	y = rn2(3);
	miniwalk(x, y);
	lev->nroom = 0;
	for (y=0; y<3; y++) for(x=0; x<3; x++) {
		if (here.real) { /* Make a room */
			int lowx, lowy, hix, hiy;

			r[x][y].nroom = lev->nroom;
			smeq[lev->nroom] = lev->nroom;

			lowx = 1 + 26*x + here.rlx;
			lowy = 7*y + here.rly;
			hix = 1 + 26*x + here.rlx + here.dx - 1;
			hiy = 7*y + here.rly + here.dy - 1;
			/* Strictly speaking, it should be lit only if above
			 * level 10, but since Rogue rooms are only
			 * encountered below level 10, use !rn2(7).
			 */
			add_room(lev, lowx, lowy, hix, hiy,
				 (boolean) !rn2(7), OROOM, FALSE);
		}
	}

	/* Now, add connecting corridors. */
	for (y=0; y<3; y++) for(x=0; x<3; x++) {
		if (here.doortable & DOWN)
			roguecorr(lev, x, y, DOWN);
		if (here.doortable & RIGHT)
			roguecorr(lev, x, y, RIGHT);
		if (here.doortable & LEFT)
			impossible ("left end of %d, %d never connected?",x,y);
		if (here.doortable & UP)
			impossible ("up end of %d, %d never connected?",x,y);
	}
}